

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadataWithArenaLite *metadata,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint value;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  LogMessage *other;
  string *s;
  MessageLite *pMVar6;
  void *pvVar7;
  char *pcVar8;
  ulong value_00;
  undefined4 extraout_var;
  uint64 value_01;
  FieldType FVar9;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  FieldDescriptor *pFVar10;
  LogFinisher local_71;
  uint64 val;
  char *local_38;
  
  iVar4 = extension->type - 1;
  local_38 = ptr;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(iVar4) {
    case 0:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x01',extension->is_packed,extension->descriptor);
      pcVar8 = PackedDoubleParser(pvVar7,ptr,ctx);
      return pcVar8;
    case 1:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x02',extension->is_packed,extension->descriptor);
      pcVar8 = PackedFloatParser(pvVar7,ptr,ctx);
      return pcVar8;
    case 2:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x03',extension->is_packed,extension->descriptor);
      pcVar8 = PackedInt64Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 3:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x04',extension->is_packed,extension->descriptor);
      pcVar8 = PackedUInt64Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 4:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x05',extension->is_packed,extension->descriptor);
      pcVar8 = PackedInt32Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 5:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x06',extension->is_packed,extension->descriptor);
      pcVar8 = PackedFixed64Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 6:
      pvVar7 = MutableRawRepeatedField(this,number,'\a',extension->is_packed,extension->descriptor);
      pcVar8 = PackedFixed32Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 7:
      pvVar7 = MutableRawRepeatedField(this,number,'\b',extension->is_packed,extension->descriptor);
      pcVar8 = PackedBoolParser(pvVar7,ptr,ctx);
      return pcVar8;
    case 8:
    case 9:
    case 10:
    case 0xb:
      LogMessage::LogMessage
                ((LogMessage *)&val,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4e);
      other = LogMessage::operator<<((LogMessage *)&val,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage((LogMessage *)&val);
      return ptr;
    case 0xc:
      pvVar7 = MutableRawRepeatedField(this,number,'\r',extension->is_packed,extension->descriptor);
      pcVar8 = PackedUInt32Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 0xd:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x0e',extension->is_packed,extension->descriptor);
      pcVar8 = PackedEnumParserArg(pvVar7,ptr,ctx,
                                   (_func_bool_void_ptr_int *)
                                   (extension->field_3).enum_validity_check.func,
                                   (extension->field_3).enum_validity_check.arg,metadata,number);
      return pcVar8;
    case 0xe:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x0f',extension->is_packed,extension->descriptor);
      pcVar8 = PackedSFixed32Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 0xf:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x10',extension->is_packed,extension->descriptor);
      pcVar8 = PackedSFixed64Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 0x10:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x11',extension->is_packed,extension->descriptor);
      pcVar8 = PackedSInt32Parser(pvVar7,ptr,ctx);
      return pcVar8;
    case 0x11:
      pvVar7 = MutableRawRepeatedField
                         (this,number,'\x12',extension->is_packed,extension->descriptor);
      pcVar8 = PackedSInt64Parser(pvVar7,ptr,ctx);
      return pcVar8;
    default:
      return ptr;
    }
  }
  pcVar8 = ptr;
  switch(iVar4) {
  case 0:
    pcVar8 = ptr + 8;
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,*(double *)ptr,extension->descriptor);
    }
    else {
      SetDouble(this,number,'\x01',*(double *)ptr,extension->descriptor);
    }
    break;
  case 1:
    pcVar8 = ptr + 4;
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,*(float *)ptr,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',*(float *)ptr,extension->descriptor);
    }
    break;
  case 2:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 == (char *)0x0) goto LAB_002902e7;
    if (extension->is_repeated != true) {
      value_00 = CONCAT44(val._4_4_,(uint32)val);
      pFVar10 = extension->descriptor;
      FVar9 = '\x03';
      goto LAB_00290380;
    }
    bVar3 = extension->is_packed;
    value_00 = CONCAT44(val._4_4_,(uint32)val);
    pFVar10 = extension->descriptor;
    FVar9 = '\x03';
    goto LAB_00290053;
  case 3:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 != (char *)0x0) {
      if (extension->is_repeated != true) {
        value_01 = CONCAT44(val._4_4_,(uint32)val);
        pFVar10 = extension->descriptor;
        FVar9 = '\x04';
        goto LAB_00290369;
      }
      bVar3 = extension->is_packed;
      value_01 = CONCAT44(val._4_4_,(uint32)val);
      pFVar10 = extension->descriptor;
      FVar9 = '\x04';
      goto LAB_0029014b;
    }
    goto LAB_002902e7;
  case 4:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 != (char *)0x0) {
      if (extension->is_repeated != true) {
        pFVar10 = extension->descriptor;
        FVar9 = '\x05';
        goto LAB_0029033c;
      }
      bVar3 = extension->is_packed;
      pFVar10 = extension->descriptor;
      FVar9 = '\x05';
      goto LAB_0028fd24;
    }
    goto LAB_002902e7;
  case 5:
    value_01 = *(uint64 *)ptr;
    pcVar8 = ptr + 8;
    if (extension->is_repeated != true) {
      pFVar10 = extension->descriptor;
      FVar9 = '\x06';
LAB_00290369:
      SetUInt64(this,number,FVar9,value_01,pFVar10);
      return pcVar8;
    }
    bVar3 = extension->is_packed;
    pFVar10 = extension->descriptor;
    FVar9 = '\x06';
LAB_0029014b:
    AddUInt64(this,number,FVar9,bVar3,value_01,pFVar10);
    break;
  case 6:
    val._0_4_ = *(uint32 *)ptr;
    pcVar8 = ptr + 4;
    if (extension->is_repeated != true) {
      pFVar10 = extension->descriptor;
      FVar9 = '\a';
LAB_00290321:
      SetUInt32(this,number,FVar9,(uint32)val,pFVar10);
      return pcVar8;
    }
    bVar3 = extension->is_packed;
    pFVar10 = extension->descriptor;
    FVar9 = '\a';
LAB_002901d4:
    AddUInt32(this,number,FVar9,bVar3,(uint32)val,pFVar10);
    break;
  case 7:
    pcVar8 = ptr + 1;
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,(bool)(*ptr & 1),extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',(bool)(*ptr & 1),extension->descriptor);
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    uVar5 = ReadSize(&local_38);
    if (local_38 != (char *)0x0) {
      pcVar8 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,local_38,uVar5,s);
      return pcVar8;
    }
    goto LAB_002902e7;
  case 9:
    pMVar6 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar6 = AddMessage(this,number,'\n',pMVar6,extension->descriptor);
    }
    else {
      pMVar6 = MutableMessage(this,number,'\n',pMVar6,extension->descriptor);
    }
    iVar4 = ctx->depth_;
    ctx->depth_ = iVar4 + -1;
    if (0 < iVar4) {
      ctx->group_depth_ = ctx->group_depth_ + 1;
      iVar4 = (*pMVar6->_vptr_MessageLite[0xd])(pMVar6,ptr,ctx);
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar5 != number * 8 + 3U) {
        return (char *)0x0;
      }
      return (char *)CONCAT44(extraout_var,iVar4);
    }
    goto LAB_002902e7;
  case 10:
    pMVar6 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar6 = AddMessage(this,number,'\v',pMVar6,extension->descriptor);
    }
    else {
      pMVar6 = MutableMessage(this,number,'\v',pMVar6,extension->descriptor);
    }
    pcVar8 = ParseContext::ParseMessage(ctx,pMVar6,ptr);
    return pcVar8;
  case 0xc:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 != (char *)0x0) {
      if (extension->is_repeated != true) {
        pFVar10 = extension->descriptor;
        FVar9 = '\r';
        goto LAB_00290321;
      }
      bVar3 = extension->is_packed;
      pFVar10 = extension->descriptor;
      FVar9 = '\r';
      goto LAB_002901d4;
    }
    goto LAB_002902e7;
  case 0xd:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    value = (uint32)val;
    if (pcVar8 != (char *)0x0) {
      bVar3 = (*(extension->field_3).enum_validity_check.func)
                        ((extension->field_3).enum_validity_check.arg,(uint32)val);
      if (!bVar3) {
        if ((*(ulong *)metadata & 1) == 0) {
          s_00 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::mutable_unknown_fields_slow
                           ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)metadata);
        }
        else {
          s_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(ulong *)metadata & 0xfffffffffffffffe);
        }
        WriteVarint(number,CONCAT44(val._4_4_,(uint32)val),s_00);
        return pcVar8;
      }
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
        return pcVar8;
      }
      SetEnum(this,number,'\x0e',value,extension->descriptor);
      return pcVar8;
    }
    goto LAB_002902e7;
  case 0xe:
    val._0_4_ = *(uint32 *)ptr;
    pcVar8 = ptr + 4;
    if (extension->is_repeated != true) {
      pFVar10 = extension->descriptor;
      FVar9 = '\x0f';
LAB_0029033c:
      SetInt32(this,number,FVar9,(uint32)val,pFVar10);
      return pcVar8;
    }
    bVar3 = extension->is_packed;
    pFVar10 = extension->descriptor;
    FVar9 = '\x0f';
LAB_0028fd24:
    AddInt32(this,number,FVar9,bVar3,(uint32)val,pFVar10);
    break;
  case 0xf:
    value_00 = *(ulong *)ptr;
    pcVar8 = ptr + 8;
    if (extension->is_repeated != true) {
      pFVar10 = extension->descriptor;
      FVar9 = '\x10';
LAB_00290380:
      SetInt64(this,number,FVar9,value_00,pFVar10);
      return pcVar8;
    }
    bVar3 = extension->is_packed;
    pFVar10 = extension->descriptor;
    FVar9 = '\x10';
    goto LAB_00290053;
  case 0x10:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 != (char *)0x0) {
      val._0_4_ = -((uint32)val & 1) ^ (uint32)val >> 1;
      if (extension->is_repeated != true) {
        pFVar10 = extension->descriptor;
        FVar9 = '\x11';
        goto LAB_0029033c;
      }
      bVar3 = extension->is_packed;
      pFVar10 = extension->descriptor;
      FVar9 = '\x11';
      goto LAB_0028fd24;
    }
LAB_002902e7:
    pcVar8 = (char *)0x0;
    break;
  case 0x11:
    pcVar8 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar8 == (char *)0x0) goto LAB_002902e7;
    value_00 = -(ulong)((uint32)val & 1) ^ CONCAT44(val._4_4_,(uint32)val) >> 1;
    if (extension->is_repeated != true) {
      pFVar10 = extension->descriptor;
      FVar9 = '\x12';
      goto LAB_00290380;
    }
    bVar3 = extension->is_packed;
    pFVar10 = extension->descriptor;
    FVar9 = '\x12';
LAB_00290053:
    AddInt64(this,number,FVar9,bVar3,value_00,pFVar10);
  }
  return pcVar8;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    T* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 value;                                                           \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 val;                                                             \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
      HANDLE_FIXED_TYPE(BOOL, Bool, bool);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64 val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32 tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}